

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O3

void __thiscall DemoScripts::RunDummyModel(DemoScripts *this)

{
  float *pfVar1;
  float *pfVar2;
  pointer pfVar3;
  value_type_conflict *__val;
  ostream *poVar4;
  initializer_list<float> __l;
  BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager> model;
  allocator_type local_e9;
  vector<float,_std::allocator<float>_> local_e8;
  vector<float,_std::allocator<float>_> local_d0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager> local_a0;
  
  BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager>::BasicNetwork(&local_a0,1,1,true);
  INetwork::AddLink(&local_a0.super_INetwork,0,1,100.0,0.1);
  INetwork::AddLink(&local_a0.super_INetwork,0,2,100.0,0.15);
  INetwork::AddLink(&local_a0.super_INetwork,0,3,100.0,0.05);
  INetwork::AddLink(&local_a0.super_INetwork,0,4,100.0,0.2);
  local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(4);
  local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
  *local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
   _M_start = 0.0;
  local_b8 = 0x42c800003f000000;
  uStack_b0 = 0x42c8000042c80000;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_b8;
  local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  std::vector<float,_std::allocator<float>_>::vector(&local_d0,__l,&local_e9);
  INetwork::Forward(&local_a0.super_INetwork,&local_d0,&local_e8,4.0);
  pfVar1 = local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pfVar1 = local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar2 = local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  for (; pfVar3 = local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish,
      pfVar1 != local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish; pfVar1 = pfVar1 + 1) {
    local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = pfVar2;
    poVar4 = std::ostream::_M_insert<double>((double)*pfVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    pfVar2 = local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = pfVar3;
  }
  local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = pfVar2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager>::~BasicNetwork(&local_a0);
  return;
}

Assistant:

void DemoScripts::RunDummyModel()
{
    const int INPUT_SIZE = 1;
    const int OUTPUT_SIZE = 1;
    auto model = BasicNetwork<LifNeuron, LifSynapse, PreciseEventManager>( INPUT_SIZE, OUTPUT_SIZE, true );

    model.AddLink( 0, 1, 100, 0.1 );
    model.AddLink( 0, 2, 100, 0.15 );
    model.AddLink( 0, 3, 100, 0.05 );
    model.AddLink( 0, 4, 100, 0.2 );

    std::vector<float> output( OUTPUT_SIZE );

    model.Forward( {0.5, 100, 100, 100}, output, 4 );

    for ( auto activation: output ) {
        std::cout << activation << " ";
    }
    std::cout << "\n";
}